

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_kaku.c
# Opt level: O2

uint8_t * encode_kaku(uint8_t *enc_data,uint8_t b)

{
  long lVar1;
  
  for (lVar1 = 0; (int)lVar1 != 0x38; lVar1 = lVar1 + 7) {
    (enc_data + lVar1)[0] = 0xff;
    (enc_data + lVar1)[1] = '\0';
    enc_data[lVar1 + 2] = (char)~b >> 7;
    (enc_data + lVar1 + 3)[0] = '\0';
    (enc_data + lVar1 + 3)[1] = '\0';
    enc_data[lVar1 + 5] = (char)b >> 7;
    enc_data[lVar1 + 6] = '\0';
    b = b * '\x02';
  }
  return enc_data + lVar1;
}

Assistant:

static uint8_t *encode_kaku(uint8_t *enc_data, uint8_t b) 
{
	int i;

	i=8;
	while (i > 0) {
		if (b & 0x80) {
			enc_data[0] = 0xff;
			enc_data[1] = 0x00;
			enc_data[2] = 0x00;
			enc_data[3] = 0x00;
			enc_data[4] = 0x00;
			enc_data[5] = 0xff;
			enc_data[6] = 0x00;
		} else {
			enc_data[0] = 0xff;
			enc_data[1] = 0x00;
			enc_data[2] = 0xff;
			enc_data[3] = 0x00;
			enc_data[4] = 0x00;
			enc_data[5] = 0x00;
			enc_data[6] = 0x00;
		}
		b <<= 1;

		enc_data += 7;
		i--;
	}

	return enc_data;
}